

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_tls_read_curve_info(mbedtls_ecp_curve_info **curve_info,uchar **buf,size_t blen)

{
  uchar uVar1;
  uchar *puVar2;
  int iVar3;
  mbedtls_ecp_curve_info *pmVar4;
  
  iVar3 = -0x4f80;
  if (2 < blen) {
    puVar2 = *buf;
    *buf = puVar2 + 1;
    if (*puVar2 == '\x03') {
      *buf = puVar2 + 2;
      uVar1 = puVar2[1];
      *buf = puVar2 + 3;
      pmVar4 = mbedtls_ecp_curve_info_from_tls_id(CONCAT11(uVar1,puVar2[2]));
      *curve_info = pmVar4;
      iVar3 = -0x4e80;
      if (pmVar4 != (mbedtls_ecp_curve_info *)0x0) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_ecp_tls_read_curve_info( mbedtls_ecp_curve_info const* *curve_info,
  const unsigned char **buf, size_t blen )
{
    uint16_t tls_id;

    /*
     * We expect at least three bytes (see below)
     */
    if( blen < 3 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * First byte is curve_type; only named_curve is handled
     */
    if( *(*buf)++ != MBEDTLS_ECP_TLS_NAMED_CURVE )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * Next two bytes are the namedcurve value
     */
    tls_id = *(*buf)++;
    tls_id <<= 8;
    tls_id |= *(*buf)++;

    if( ( *curve_info = mbedtls_ecp_curve_info_from_tls_id( tls_id ) ) == NULL )
        return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );

    return( 0 );
}